

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O2

bool re2::IsMatch(Prog *prog,Inst *ip)

{
  uint uVar1;
  
  while( true ) {
    uVar1 = ip->out_opcode_ & 7;
    if ((0x48U >> uVar1 & 1) == 0) break;
    ip = (Inst *)((long)&prog->inst_->out_opcode_ + (ulong)(ip->out_opcode_ >> 1 & 0xfffffff8));
  }
  if ((0x97U >> uVar1 & 1) != 0) {
    return false;
  }
  return true;
}

Assistant:

static bool IsMatch(Prog* prog, Prog::Inst* ip) {
  for (;;) {
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "Unexpected opcode in IsMatch: " << ip->opcode();
        return false;

      case kInstAlt:
      case kInstAltMatch:
      case kInstByteRange:
      case kInstFail:
      case kInstEmptyWidth:
        return false;

      case kInstCapture:
      case kInstNop:
        ip = prog->inst(ip->out());
        break;

      case kInstMatch:
        return true;
    }
  }
}